

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_ComputeFastMerkleRootTest1_Test::TestBody
          (CryptoUtil_ComputeFastMerkleRootTest1_Test *this)

{
  pointer lhs;
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::core::ByteData256> __l_00;
  allocator_type local_17e;
  allocator local_17d;
  allocator local_17c;
  allocator_type local_17b;
  allocator local_17a;
  allocator local_179;
  string local_178;
  AssertionResult gtest_ar;
  ByteData256 root_1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> test_roots;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> test_leaves;
  ByteData256 root;
  ByteData256 local_b0;
  ByteData256 local_98;
  ByteData256 local_80;
  ByteData256 local_68;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_178,"0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"
             ,(allocator *)&local_50);
  cfd::core::ByteData256::ByteData256(&root,&local_178);
  std::__cxx11::string::string
            ((string *)&leaves,"56aa859e86b5decd00dda32c9bc4de144337689d23f29ca3ed6e7b8fa311b0a5",
             (allocator *)&test_roots);
  cfd::core::ByteData256::ByteData256(&local_b0,(string *)&leaves);
  std::__cxx11::string::string
            ((string *)&root_1,"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5",
             &local_17c);
  cfd::core::ByteData256::ByteData256(&local_98,(string *)&root_1);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"9695c03041bc01aea1d8af998f9fa3e529c98492acc883df4e2dc786c112123a",
             &local_17d);
  cfd::core::ByteData256::ByteData256(&local_80,(string *)&gtest_ar);
  __l._M_len = 4;
  __l._M_array = &root;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&test_leaves,__l,&local_17e);
  lVar1 = 0x48;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&root_1);
  std::__cxx11::string::~string((string *)&leaves);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string
            ((string *)&local_178,"0000000000000000000000000000000000000000000000000000000000000000"
             ,&local_17c);
  cfd::core::ByteData256::ByteData256(&root,&local_178);
  std::__cxx11::string::string
            ((string *)&leaves,"0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59",
             &local_17d);
  cfd::core::ByteData256::ByteData256(&local_b0,(string *)&leaves);
  std::__cxx11::string::string
            ((string *)&root_1,"a763f33a89bc137a88e25eede516ffefc98fb98e95c00b9bdc70b12538fe9e2a",
             (allocator *)&local_17e);
  cfd::core::ByteData256::ByteData256(&local_98,(string *)&root_1);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"e608818b7b3e1253e3de2f1f657392df21689dee5d5176205d4f28eb72801994",
             &local_179);
  cfd::core::ByteData256::ByteData256(&local_80,(string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&local_50,"41ad854abd919bf323dc869b5826ecef841685bd44d9c7af23aa42900fb193af",
             &local_17a);
  cfd::core::ByteData256::ByteData256(&local_68,&local_50);
  __l_00._M_len = 5;
  __l_00._M_array = &root;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&test_roots,__l_00,&local_17b);
  lVar1 = 0x60;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&root_1);
  std::__cxx11::string::~string((string *)&leaves);
  std::__cxx11::string::~string((string *)&local_178);
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)test_leaves.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)test_leaves.
                            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    cfd::core::CryptoUtil::ComputeFastMerkleRoot
              (&root_1,(vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                       &leaves);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&root,&root_1);
    lhs = root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    cfd::core::ByteData256::GetHex_abi_cxx11_
              (&local_178,
               (ByteData256 *)
               ((long)&((test_roots.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1));
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"root.GetHex().c_str()","test_roots[i].GetHex().c_str()",
               (char *)lhs,local_178._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&root);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&root);
      std::operator<<((ostream *)
                      (root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x10),"index: ");
      std::ostream::_M_insert<unsigned_long>
                ((ulong)(root.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x10));
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
                 ,0x2b0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&root);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&root);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              (&leaves,(value_type *)
                       ((long)&((test_leaves.
                                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar1));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&root_1);
    lVar1 = lVar1 + 0x18;
  }
  cfd::core::CryptoUtil::ComputeFastMerkleRoot
            (&root,(vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                   &leaves);
  cfd::core::ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,&root);
  cfd::core::ByteData256::GetBytes
            (&root_1.data_,
             test_roots.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar,"root.GetBytes()","test_roots.back().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,&root_1.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&root_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_178);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&root_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x2b4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&root_1,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&root_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_178);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&root);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&leaves);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&test_roots)
  ;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&test_leaves);
  return;
}

Assistant:

TEST(CryptoUtil, ComputeFastMerkleRootTest1) {
  std::vector<ByteData256> test_leaves = {
    ByteData256("0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"),
    ByteData256("56aa859e86b5decd00dda32c9bc4de144337689d23f29ca3ed6e7b8fa311b0a5"),
    ByteData256("7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5"),
    ByteData256("9695c03041bc01aea1d8af998f9fa3e529c98492acc883df4e2dc786c112123a"),
  };
  std::vector<ByteData256> test_roots = {
    ByteData256("0000000000000000000000000000000000000000000000000000000000000000"),
    ByteData256("0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"),
    ByteData256("a763f33a89bc137a88e25eede516ffefc98fb98e95c00b9bdc70b12538fe9e2a"),
    ByteData256("e608818b7b3e1253e3de2f1f657392df21689dee5d5176205d4f28eb72801994"),
    ByteData256("41ad854abd919bf323dc869b5826ecef841685bd44d9c7af23aa42900fb193af"),
  };
  std::vector<ByteData256> leaves;
  
  for(size_t i = 0; i < test_leaves.size(); ++i) {
    ByteData256 root = CryptoUtil::ComputeFastMerkleRoot(leaves);
    EXPECT_STREQ(root.GetHex().c_str(), test_roots[i].GetHex().c_str()) << "index: " << i;
    leaves.push_back(test_leaves[i]);
  }
  ByteData256 root = CryptoUtil::ComputeFastMerkleRoot(leaves);
  EXPECT_EQ(root.GetBytes(), test_roots.back().GetBytes());
}